

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_set_desired_capabilities(ATTACH_HANDLE attach,AMQP_VALUE desired_capabilities_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x1462;
  }
  else {
    iVar2 = 0x1472;
    if (desired_capabilities_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(desired_capabilities_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(attach->composite_value,0xc,item_value);
        iVar2 = 0x1478;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int attach_set_desired_capabilities(ATTACH_HANDLE attach, AMQP_VALUE desired_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE desired_capabilities_amqp_value;
        if (desired_capabilities_value == NULL)
        {
            desired_capabilities_amqp_value = NULL;
        }
        else
        {
            desired_capabilities_amqp_value = amqpvalue_clone(desired_capabilities_value);
        }
        if (desired_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 12, desired_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(desired_capabilities_amqp_value);
        }
    }

    return result;
}